

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texparameterfv(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  allocator<char> local_f1;
  string local_f0;
  deUint32 local_cc;
  ContextType local_c8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLfloat local_14;
  GLuint texture;
  GLfloat params [1];
  NegativeTestContext *ctx_local;
  
  local_14 = 9729.0;
  local_18 = 0x1234;
  _texture = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindTexture(&_texture->super_CallLogWrapper,0xde1,local_18);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = 9729.0;
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0,0x2801,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0,0,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_14 = -1.0;
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x90ea,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x884c,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x884d,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x2800,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x2801,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x8e42,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x8e43,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x8e44,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x8e45,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x2802,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x2803,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x8072,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x813c,&local_14);
  NegativeTestContext::expectError(_texture,0x501);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0xde1,0x813d,&local_14);
  NegativeTestContext::expectError(_texture,0x501);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x1004,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x2801,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x2800,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x2802,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x2803,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x8072,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x813a,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x813b,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x884c,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x884d,&local_14);
  NegativeTestContext::expectError(_texture,0x500);
  pRVar3 = NegativeTestContext::getRenderContext(_texture);
  local_c8.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_cc = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_c8,(ApiType)local_cc);
  if (bVar2) {
LAB_00915f0a:
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x1004,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x2801,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x2800,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x2802,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x2803,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x8072,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x813a,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x813b,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x884c,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x884d,&local_14);
    NegativeTestContext::expectError(_texture,0x500);
  }
  else {
    pCVar4 = NegativeTestContext::getContextInfo(_texture);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar2) goto LAB_00915f0a;
  }
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_f1);
  NegativeTestContext::beginSection(pNVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_14 = 1.0;
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9100,0x813c,&local_14);
  NegativeTestContext::expectError(_texture,0x502);
  pRVar3 = NegativeTestContext::getRenderContext(_texture);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar2) {
    pCVar4 = NegativeTestContext::getContextInfo(_texture);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) goto LAB_009162bb;
  }
  local_14 = 1.0;
  glu::CallLogWrapper::glTexParameterfv(&_texture->super_CallLogWrapper,0x9102,0x813c,&local_14);
  NegativeTestContext::expectError(_texture,0x502);
LAB_009162bb:
  NegativeTestContext::endSection(_texture);
  glu::CallLogWrapper::glDeleteTextures(&_texture->super_CallLogWrapper,1,&local_18);
  return;
}

Assistant:

void texparameterfv (NegativeTestContext& ctx)
{
	GLfloat params[1] = {GL_LINEAR};
	GLuint texture = 0x1234;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	params[0] = GL_LINEAR;
	ctx.glTexParameterfv(0, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(0, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	params[0] = -1.0f;
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	params[0] = 1.0f;
	ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		params[0] = 1.0f;
		ctx.glTexParameterfv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, &params[0]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}